

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void compile_assert_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  PCRE2_UCHAR16 PVar1;
  PCRE2_UCHAR16 PVar2;
  sljit_compiler *compiler;
  PCRE2_SPTR16 pPVar3;
  jump_list *pjVar4;
  sljit_jump *psVar5;
  sljit_jump *psVar6;
  sljit_label *psVar7;
  
  compiler = common->compiler;
  pPVar3 = current->cc;
  PVar1 = *pPVar3;
  if (PVar1 == 0x93) {
    sljit_emit_op1(compiler,0x20,2,0,0x8c,0);
    if (-1 < *(int *)&current[1].nextbacktracks) {
      PVar2 = pPVar3[1];
      if ((PVar2 != 0x81) && (PVar2 != 0x7f)) {
        free_stack(common,1);
        psVar5 = sljit_emit_cmp(compiler,0,2,0,0x40,0);
        pPVar3 = pPVar3 + 1;
        goto LAB_00144e6a;
      }
      goto LAB_00144fd0;
    }
  }
  else if (-1 < *(int *)&current[1].nextbacktracks) {
    psVar5 = (sljit_jump *)0x0;
LAB_00144e6a:
    if ((*pPVar3 == 0x80) || (*pPVar3 == 0x7e)) {
      sljit_emit_op1(compiler,0x20,0xc,0,0x8e,(long)*(int *)((long)&current[1].nextbacktracks + 4));
      psVar6 = sljit_emit_jump(compiler,0x19);
      add_jump(compiler,&common->revertframes,psVar6);
      sljit_emit_op1(compiler,0x20,1,0,0x8c,-0x10);
      sljit_emit_op2(compiler,0x60,0xc,0,0xc,0,0x40,
                     (long)*(int *)&current[1].nextbacktracks * 8 + -8);
      sljit_emit_op1(compiler,0x20,0x8e,(long)*(int *)((long)&current[1].nextbacktracks + 4),1,0);
    }
    pjVar4 = current->topbacktracks;
    psVar7 = sljit_emit_label(compiler);
    set_jumps(pjVar4,psVar7);
    if (PVar1 != 0x93) {
      return;
    }
    sljit_emit_op2(compiler,0x62,0xc,0,0xc,0,0x40,8);
    sljit_emit_op1(compiler,0x20,0x8c,0,0x40,0);
    psVar6 = sljit_emit_jump(compiler,0x18);
    sljit_set_label(psVar6,(sljit_label *)current[1].top);
    psVar7 = sljit_emit_label(compiler);
    sljit_set_label(psVar5,psVar7);
    return;
  }
  pjVar4 = current->topbacktracks;
  psVar7 = sljit_emit_label(compiler);
  set_jumps(pjVar4,psVar7);
  if (PVar1 != 0x93) {
    return;
  }
LAB_00144fd0:
  sljit_emit_op1(compiler,0x20,0x8c,0,0x40,0);
  psVar5 = sljit_emit_cmp(compiler,1,2,0,0x40,0);
  sljit_set_label(psVar5,(sljit_label *)current[1].top);
  free_stack(common,1);
  return;
}

Assistant:

static void compile_assert_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
PCRE2_SPTR cc = current->cc;
PCRE2_UCHAR bra = OP_BRA;
struct sljit_jump *brajump = NULL;

SLJIT_ASSERT(*cc != OP_BRAMINZERO);
if (*cc == OP_BRAZERO)
  {
  bra = *cc;
  cc++;
  }

if (bra == OP_BRAZERO)
  {
  SLJIT_ASSERT(current->topbacktracks == NULL);
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
  }

if (CURRENT_AS(assert_backtrack)->framesize < 0)
  {
  set_jumps(current->topbacktracks, LABEL());

  if (bra == OP_BRAZERO)
    {
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    CMPTO(SLJIT_NOT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0, CURRENT_AS(assert_backtrack)->matchingpath);
    free_stack(common, 1);
    }
  return;
  }

if (bra == OP_BRAZERO)
  {
  if (*cc == OP_ASSERT_NOT || *cc == OP_ASSERTBACK_NOT)
    {
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    CMPTO(SLJIT_NOT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0, CURRENT_AS(assert_backtrack)->matchingpath);
    free_stack(common, 1);
    return;
    }
  free_stack(common, 1);
  brajump = CMP(SLJIT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0);
  }

if (*cc == OP_ASSERT || *cc == OP_ASSERTBACK)
  {
  OP1(SLJIT_MOV, STACK_TOP, 0, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(assert_backtrack)->private_data_ptr);
  add_jump(compiler, &common->revertframes, JUMP(SLJIT_FAST_CALL));
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(-2));
  OP2(SLJIT_ADD, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, (CURRENT_AS(assert_backtrack)->framesize - 1) * sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(assert_backtrack)->private_data_ptr, TMP1, 0);

  set_jumps(current->topbacktracks, LABEL());
  }
else
  set_jumps(current->topbacktracks, LABEL());

if (bra == OP_BRAZERO)
  {
  /* We know there is enough place on the stack. */
  OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
  JUMPTO(SLJIT_JUMP, CURRENT_AS(assert_backtrack)->matchingpath);
  JUMPHERE(brajump);
  }
}